

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

shared_ptr<dlib::timer_global_clock> dlib::get_global_clock(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  timer_global_clock *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  shared_ptr<dlib::timer_global_clock> sVar3;
  
  if (get_global_clock()::d == '\0') {
    iVar2 = __cxa_guard_acquire(&get_global_clock()::d);
    in_RDX._M_pi = extraout_RDX;
    if (iVar2 != 0) {
      this = (timer_global_clock *)operator_new(0x168);
      timer_global_clock::timer_global_clock(this);
      get_global_clock::d.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<dlib::timer_global_clock*>
                (&get_global_clock::d.
                  super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this);
      __cxa_atexit(std::__shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&get_global_clock::d,&__dso_handle);
      __cxa_guard_release(&get_global_clock()::d);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  (in_RDI->super_threaded_object)._vptr_threaded_object =
       (_func_int **)
       get_global_clock::d.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  _Var1 = get_global_clock::d.
          super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (in_RDI->super_threaded_object).m_.myMutex.__align =
       (long)get_global_clock::d.
             super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar3.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<dlib::timer_global_clock>)
         sVar3.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<timer_global_clock> get_global_clock()
    {
        static std::shared_ptr<timer_global_clock> d(new timer_global_clock);
        return d;
    }